

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamAlignment.cpp
# Opt level: O2

void __thiscall BamTools::BamAlignment::BamAlignment(BamAlignment *this,BamAlignment *other)

{
  int32_t iVar1;
  uint16_t uVar2;
  
  std::__cxx11::string::string((string *)this,(string *)other);
  this->Length = other->Length;
  std::__cxx11::string::string((string *)&this->QueryBases,(string *)&other->QueryBases);
  std::__cxx11::string::string((string *)&this->AlignedBases,(string *)&other->AlignedBases);
  std::__cxx11::string::string((string *)&this->Qualities,(string *)&other->Qualities);
  std::__cxx11::string::string((string *)&this->TagData,(string *)&other->TagData);
  iVar1 = other->Position;
  this->RefID = other->RefID;
  this->Position = iVar1;
  uVar2 = other->MapQuality;
  this->Bin = other->Bin;
  this->MapQuality = uVar2;
  this->AlignmentFlag = other->AlignmentFlag;
  std::vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>::vector
            (&this->CigarData,&other->CigarData);
  iVar1 = other->MatePosition;
  this->MateRefID = other->MateRefID;
  this->MatePosition = iVar1;
  this->InsertSize = other->InsertSize;
  std::__cxx11::string::string((string *)&this->Filename,(string *)&other->Filename);
  BamAlignmentSupportData::BamAlignmentSupportData(&this->SupportData,&other->SupportData);
  (this->ErrorString)._M_dataplus._M_p = (pointer)&(this->ErrorString).field_2;
  (this->ErrorString)._M_string_length = 0;
  (this->ErrorString).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

BamAlignment::BamAlignment(const BamAlignment& other)
    : Name(other.Name)
    , Length(other.Length)
    , QueryBases(other.QueryBases)
    , AlignedBases(other.AlignedBases)
    , Qualities(other.Qualities)
    , TagData(other.TagData)
    , RefID(other.RefID)
    , Position(other.Position)
    , Bin(other.Bin)
    , MapQuality(other.MapQuality)
    , AlignmentFlag(other.AlignmentFlag)
    , CigarData(other.CigarData)
    , MateRefID(other.MateRefID)
    , MatePosition(other.MatePosition)
    , InsertSize(other.InsertSize)
    , Filename(other.Filename)
    , SupportData(other.SupportData)
{ }